

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::die(char *str)

{
  raw_ostream *prVar1;
  int local_14;
  int i;
  char *str_local;
  
  prVar1 = (raw_ostream *)llvm::errs();
  prVar1 = llvm::raw_ostream::operator<<(prVar1,"ABORTING: ");
  prVar1 = llvm::raw_ostream::operator<<(prVar1,str);
  llvm::raw_ostream::operator<<(prVar1,"\n");
  if (((anonymous_namespace)::Init & 1) == 0) {
    *(undefined1 *)((anonymous_namespace)::Shmem + 0x1490) = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
    *(undefined1 *)((anonymous_namespace)::Shmem + 0x1490) = 1;
    for (local_14 = 0; local_14 < 100; local_14 = local_14 + 1) {
      pthread_cond_broadcast
                ((pthread_cond_t *)((anonymous_namespace)::Shmem + 0x38 + (long)local_14 * 0x30));
    }
    pthread_mutex_unlock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 8));
  }
  exit(-1);
}

Assistant:

void die(const char *str) {
  errs() << "ABORTING: " << str << "\n";
  if (Init) {
    // not checking return value here...
    pthread_mutex_lock(&Shmem->Lock);
    Shmem->Stop = true;
    for (int i = 0; i < MAX_DEPTH; ++i)
      pthread_cond_broadcast(&Shmem->Cond[i]);
    pthread_mutex_unlock(&Shmem->Lock);
  } else {
    Shmem->Stop = true;
  }
  exit(-1);
}